

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow.cpp
# Opt level: O3

void __thiscall
inputArrow::inputArrow
          (inputArrow *this,int8_t id,int startY,int startX,int arrowIndex,string *label)

{
  WINDOW *pWVar1;
  undefined4 in_register_0000000c;
  undefined8 uVar2;
  undefined4 in_register_00000014;
  undefined8 uVar3;
  char *pcVar4;
  
  uVar3 = CONCAT44(in_register_00000014,startY);
  uVar2 = CONCAT44(in_register_0000000c,startX);
  (this->super_arrowType)._vptr_arrowType = (_func_int **)&PTR_setRequest_00114b38;
  (this->super_arrowType).nodeId[0] = id;
  (this->super_arrowType).status[0] = '\x02';
  (this->super_arrowType).value[0] = 0;
  (this->super_arrowType).vert = (bool)(~(byte)arrowIndex & 1);
  if (arrowIndex == 2) {
    pWVar1 = (WINDOW *)newwin(1,0xc,uVar3,uVar2);
    (this->super_arrowType).win = pWVar1;
    pcVar4 = anon_var_dwarf_20a30;
  }
  else if (arrowIndex == 1) {
    pWVar1 = (WINDOW *)newwin(4,4,uVar3,uVar2);
    (this->super_arrowType).win = pWVar1;
    pcVar4 = anon_var_dwarf_20a26;
  }
  else if (arrowIndex == 0) {
    pWVar1 = (WINDOW *)newwin(1,0xc,uVar3,uVar2);
    (this->super_arrowType).win = pWVar1;
    pcVar4 = anon_var_dwarf_20a10;
  }
  else {
    pWVar1 = (WINDOW *)newwin(4,4,uVar3,uVar2);
    (this->super_arrowType).win = pWVar1;
    pcVar4 = anon_var_dwarf_20a3a;
  }
  wprintw(pWVar1,pcVar4);
  mvwprintw((this->super_arrowType).win,0,0,"%s",(label->_M_dataplus)._M_p);
  wrefresh((this->super_arrowType).win);
  return;
}

Assistant:

inputArrow::inputArrow(int8_t id, int startY, int startX, int arrowIndex, string label) {
	nodeId[0] = id;

	status[0] = WAIT;

	value[0] = 0;

	vert = arrowIndex % 2 == 0;

	if (arrowIndex == 0) {
		win = newwin(ARROW_V_HEIGHT, ARROW_V_WIDTH, startY, startX);
		wprintw(win, DO_ARROW);
	} else if (arrowIndex == 1) {
		win = newwin(ARROW_H_HEIGHT, ARROW_H_WIDTH, startY, startX);
		wprintw(win, LE_ARROW);
	} else if (arrowIndex == 2) {
		win = newwin(ARROW_V_HEIGHT, ARROW_V_WIDTH, startY, startX);
		wprintw(win, UP_ARROW);
	} else {
		win = newwin(ARROW_H_HEIGHT, ARROW_H_WIDTH, startY, startX);
		wprintw(win, RI_ARROW);
	}

	mvwprintw(win, 0, 0, "%s", label.c_str());
	//updateValues();

	wrefresh(win);

	return;
}